

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSpatialAlgebra.h
# Opt level: O0

void __thiscall
btSpatialTransformationMatrix::transformInverse
          (btSpatialTransformationMatrix *this,btSymmetricSpatialDyad *inMat,
          btSymmetricSpatialDyad *outMat,eOutputOperation outOp)

{
  btScalar *pbVar1;
  btScalar *pbVar2;
  int in_ECX;
  btMatrix3x3 *in_RDX;
  btScalar *in_RDI;
  btMatrix3x3 r_cross;
  btScalar *in_stack_fffffffffffff540;
  btScalar *in_stack_fffffffffffff548;
  btScalar *in_stack_fffffffffffff550;
  btMatrix3x3 *this_00;
  btMatrix3x3 *in_stack_fffffffffffff570;
  btMatrix3x3 *in_stack_fffffffffffff580;
  btMatrix3x3 *in_stack_fffffffffffff588;
  btMatrix3x3 *in_stack_fffffffffffff590;
  btScalar *in_stack_fffffffffffff598;
  btMatrix3x3 *in_stack_fffffffffffff5a8;
  btMatrix3x3 *in_stack_fffffffffffff5b0;
  btMatrix3x3 local_21c [3];
  btMatrix3x3 local_18c [5];
  btMatrix3x3 local_9c;
  undefined4 local_6c;
  btScalar local_68;
  btScalar local_64;
  undefined4 local_60;
  btScalar local_5c;
  undefined4 local_58;
  int local_24;
  btMatrix3x3 *local_20;
  
  local_58 = 0;
  local_24 = in_ECX;
  local_20 = in_RDX;
  pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xc));
  local_5c = -pbVar1[2];
  pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xc));
  pbVar1 = pbVar1 + 1;
  pbVar2 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xc));
  this_00 = (btMatrix3x3 *)(pbVar2 + 2);
  local_60 = 0;
  pbVar2 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xc));
  local_64 = -*pbVar2;
  pbVar2 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xc));
  local_68 = -pbVar2[1];
  btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xc));
  local_6c = 0;
  btMatrix3x3::btMatrix3x3
            (this_00,pbVar1,in_RDI,in_stack_fffffffffffff550,in_stack_fffffffffffff548,
             in_stack_fffffffffffff540,(btScalar *)in_stack_fffffffffffff580,
             (btScalar *)in_stack_fffffffffffff588,(btScalar *)in_stack_fffffffffffff590,
             in_stack_fffffffffffff598);
  if (local_24 == 0) {
    btMatrix3x3::transpose(in_stack_fffffffffffff570);
    ::operator*(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    operator-(in_stack_fffffffffffff590,in_stack_fffffffffffff588);
    ::operator*(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    ::operator*(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    btMatrix3x3::operator=(local_20,&local_9c);
    btMatrix3x3::transpose(in_stack_fffffffffffff570);
    ::operator*(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    ::operator*(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    btMatrix3x3::operator=(local_20 + 1,local_18c);
    btMatrix3x3::transpose(in_stack_fffffffffffff570);
    ::operator*(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    operator-(in_stack_fffffffffffff590,in_stack_fffffffffffff588);
    ::operator*(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    operator+(in_stack_fffffffffffff590,in_stack_fffffffffffff588);
    btMatrix3x3::transpose(in_stack_fffffffffffff570);
    ::operator*(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    operator-(in_stack_fffffffffffff590,in_stack_fffffffffffff588);
    ::operator*(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    ::operator*(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    btMatrix3x3::operator=(local_20 + 2,local_21c);
  }
  else if (local_24 == 1) {
    btMatrix3x3::transpose(in_stack_fffffffffffff570);
    ::operator*(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    operator-(in_stack_fffffffffffff590,in_stack_fffffffffffff588);
    ::operator*(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    ::operator*(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    btMatrix3x3::operator+=(in_stack_fffffffffffff588,in_stack_fffffffffffff580);
    btMatrix3x3::transpose(in_stack_fffffffffffff570);
    ::operator*(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    ::operator*(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    btMatrix3x3::operator+=(in_stack_fffffffffffff588,in_stack_fffffffffffff580);
    btMatrix3x3::transpose(in_stack_fffffffffffff570);
    ::operator*(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    operator-(in_stack_fffffffffffff590,in_stack_fffffffffffff588);
    ::operator*(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    operator+(in_stack_fffffffffffff590,in_stack_fffffffffffff588);
    btMatrix3x3::transpose(in_stack_fffffffffffff570);
    ::operator*(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    operator-(in_stack_fffffffffffff590,in_stack_fffffffffffff588);
    ::operator*(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    ::operator*(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    btMatrix3x3::operator+=(in_stack_fffffffffffff588,in_stack_fffffffffffff580);
  }
  else if (local_24 == 2) {
    btMatrix3x3::transpose(in_stack_fffffffffffff570);
    ::operator*(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    operator-(in_stack_fffffffffffff590,in_stack_fffffffffffff588);
    ::operator*(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    ::operator*(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    btMatrix3x3::operator-=(in_stack_fffffffffffff588,in_stack_fffffffffffff580);
    btMatrix3x3::transpose(in_stack_fffffffffffff570);
    ::operator*(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    ::operator*(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    btMatrix3x3::operator-=(in_stack_fffffffffffff588,in_stack_fffffffffffff580);
    btMatrix3x3::transpose(in_stack_fffffffffffff570);
    ::operator*(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    operator-(in_stack_fffffffffffff590,in_stack_fffffffffffff588);
    ::operator*(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    operator+(in_stack_fffffffffffff590,in_stack_fffffffffffff588);
    btMatrix3x3::transpose(in_stack_fffffffffffff570);
    ::operator*(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    operator-(in_stack_fffffffffffff590,in_stack_fffffffffffff588);
    ::operator*(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    ::operator*(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    btMatrix3x3::operator-=(in_stack_fffffffffffff588,in_stack_fffffffffffff580);
  }
  return;
}

Assistant:

void transformInverse(	const btSymmetricSpatialDyad &inMat,
							btSymmetricSpatialDyad &outMat,
							eOutputOperation outOp = None)
	{
		const btMatrix3x3 r_cross(	0, -m_trnVec[2], m_trnVec[1],
								m_trnVec[2], 0, -m_trnVec[0],
								-m_trnVec[1], m_trnVec[0], 0);


		if(outOp == None)
		{
			outMat.m_topLeftMat = m_rotMat.transpose() * ( inMat.m_topLeftMat - inMat.m_topRightMat * r_cross ) * m_rotMat;
			outMat.m_topRightMat = m_rotMat.transpose() * inMat.m_topRightMat * m_rotMat;
			outMat.m_bottomLeftMat = m_rotMat.transpose() * (r_cross * (inMat.m_topLeftMat - inMat.m_topRightMat * r_cross) + inMat.m_bottomLeftMat - inMat.m_topLeftMat.transpose() * r_cross) * m_rotMat;
		}
		else if(outOp == Add)
		{
			outMat.m_topLeftMat += m_rotMat.transpose() * ( inMat.m_topLeftMat - inMat.m_topRightMat * r_cross ) * m_rotMat;
			outMat.m_topRightMat += m_rotMat.transpose() * inMat.m_topRightMat * m_rotMat;
			outMat.m_bottomLeftMat += m_rotMat.transpose() * (r_cross * (inMat.m_topLeftMat - inMat.m_topRightMat * r_cross) + inMat.m_bottomLeftMat - inMat.m_topLeftMat.transpose() * r_cross) * m_rotMat;
		}
		else if(outOp == Subtract)
		{
			outMat.m_topLeftMat -= m_rotMat.transpose() * ( inMat.m_topLeftMat - inMat.m_topRightMat * r_cross ) * m_rotMat;
			outMat.m_topRightMat -= m_rotMat.transpose() * inMat.m_topRightMat * m_rotMat;
			outMat.m_bottomLeftMat -= m_rotMat.transpose() * (r_cross * (inMat.m_topLeftMat - inMat.m_topRightMat * r_cross) + inMat.m_bottomLeftMat - inMat.m_topLeftMat.transpose() * r_cross) * m_rotMat;
		}
	}